

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte bVar3;
  uchar uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint x_00;
  int iVar13;
  int iVar14;
  uchar *data;
  byte *pbVar15;
  uchar *puVar16;
  ulong uVar17;
  uint y_00;
  long lVar18;
  uchar *puVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  uchar *local_70;
  
  iVar5 = stbi__get16be(s);
  uVar6 = stbi__get16be(s);
  if ((uVar6 | iVar5 << 0x10) != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (stbi_uc *)0x0;
  }
  iVar5 = stbi__get16be(s);
  if (iVar5 != 1) {
    stbi__g_failure_reason = "wrong version";
    return (stbi_uc *)0x0;
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar5 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar5 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar5);
      goto LAB_00117f3f;
    }
  }
  s->img_buffer = s->img_buffer + 6;
LAB_00117f3f:
  uVar6 = stbi__get16be(s);
  if (uVar6 < 0x11) {
    iVar5 = stbi__get16be(s);
    iVar7 = stbi__get16be(s);
    iVar8 = stbi__get16be(s);
    iVar9 = stbi__get16be(s);
    iVar10 = stbi__get16be(s);
    if ((iVar10 == 8) || (iVar10 == 0x10)) {
      iVar11 = stbi__get16be(s);
      if (iVar11 == 3) {
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        stbi__skip(s,iVar11 << 0x10 | uVar12);
        uVar12 = stbi__get16be(s);
        if (uVar12 < 2) {
          iVar5 = iVar5 * 0x10000;
          y_00 = iVar5 + iVar7;
          iVar8 = iVar8 * 0x10000;
          x_00 = iVar9 + iVar8;
          iVar11 = y_00 * x_00;
          data = (uchar *)malloc((long)(iVar11 * 4));
          if (data == (uchar *)0x0) {
            stbi__g_failure_reason = "outofmem";
          }
          else {
            if (uVar12 == 0) {
              psVar1 = s->buffer_start;
              iVar13 = (iVar7 + iVar5) * (iVar8 + iVar9);
              uVar17 = 0;
              puVar19 = data;
              do {
                if (uVar17 < uVar6) {
                  if (iVar10 == 0x10) {
                    if (0 < iVar11) {
                      lVar18 = 0;
                      do {
                        iVar20 = stbi__get16be(s);
                        puVar19[lVar18 * 4] = (uchar)((uint)iVar20 >> 8);
                        lVar18 = lVar18 + 1;
                      } while (iVar13 != (int)lVar18);
                    }
                  }
                  else if (0 < iVar11) {
                    lVar18 = 0;
                    do {
                      puVar16 = s->img_buffer;
                      if (puVar16 < s->img_buffer_end) {
LAB_00118480:
                        s->img_buffer = puVar16 + 1;
                        uVar4 = *puVar16;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar20 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar1;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar1 + iVar20;
                          }
                          puVar16 = s->img_buffer;
                          goto LAB_00118480;
                        }
                        uVar4 = '\0';
                      }
                      puVar19[lVar18 * 4] = uVar4;
                      lVar18 = lVar18 + 1;
                    } while (iVar13 != (int)lVar18);
                  }
                }
                else if (0 < iVar11) {
                  lVar18 = 0;
                  do {
                    puVar19[lVar18 * 4] = -(uVar17 == 3);
                    lVar18 = lVar18 + 1;
                  } while (iVar13 != (int)lVar18);
                }
                uVar17 = uVar17 + 1;
                puVar19 = puVar19 + 1;
              } while (uVar17 != 4);
            }
            else {
              stbi__skip(s,uVar6 * y_00 * 2);
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              uVar17 = 0;
              local_70 = data;
              do {
                if (uVar17 < uVar6) {
                  if (0 < iVar11) {
                    puVar19 = data + uVar17;
                    iVar10 = 0;
                    do {
                      pbVar15 = s->img_buffer;
                      if (pbVar15 < s->img_buffer_end) {
LAB_001181ca:
                        s->img_buffer = pbVar15 + 1;
                        bVar3 = *pbVar15;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar13 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar2;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar1 + iVar13;
                          }
                          pbVar15 = s->img_buffer;
                          goto LAB_001181ca;
                        }
                        bVar3 = 0;
                      }
                      if (bVar3 != 0x80) {
                        if ((char)bVar3 < '\0') {
                          puVar16 = s->img_buffer;
                          if (puVar16 < s->img_buffer_end) {
LAB_001182ef:
                            s->img_buffer = puVar16 + 1;
                            uVar4 = *puVar16;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                              if (iVar13 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar1;
                                s->img_buffer_end = psVar2;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar1;
                                s->img_buffer_end = psVar1 + iVar13;
                              }
                              puVar16 = s->img_buffer;
                              goto LAB_001182ef;
                            }
                            uVar4 = '\0';
                          }
                          iVar13 = 0x101 - (uint)bVar3;
                          iVar20 = bVar3 - 0x101;
                          do {
                            *puVar19 = uVar4;
                            puVar19 = puVar19 + 4;
                            iVar20 = iVar20 + 1;
                          } while (iVar20 != 0);
                        }
                        else {
                          iVar13 = bVar3 + 1;
                          iVar20 = iVar13;
                          do {
                            puVar16 = s->img_buffer;
                            if (puVar16 < s->img_buffer_end) {
LAB_0011825b:
                              s->img_buffer = puVar16 + 1;
                              uVar4 = *puVar16;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                if (iVar14 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar2;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar1 + iVar14;
                                }
                                puVar16 = s->img_buffer;
                                goto LAB_0011825b;
                              }
                              uVar4 = '\0';
                            }
                            *puVar19 = uVar4;
                            puVar19 = puVar19 + 4;
                            iVar20 = iVar20 + -1;
                          } while (iVar20 != 0);
                        }
                        iVar10 = iVar10 + iVar13;
                      }
                    } while (iVar10 < iVar11);
                  }
                }
                else if (0 < iVar11) {
                  lVar18 = 0;
                  do {
                    local_70[lVar18 * 4] = -(uVar17 == 3);
                    lVar18 = lVar18 + 1;
                  } while ((iVar7 + iVar5) * (iVar8 + iVar9) != (int)lVar18);
                }
                uVar17 = uVar17 + 1;
                local_70 = local_70 + 1;
              } while (uVar17 != 4);
            }
            if ((3 < uVar6) && (0 < iVar11)) {
              uVar17 = 0;
              do {
                bVar3 = data[uVar17 * 4 + 3];
                if ((bVar3 != 0) && (bVar3 != 0xff)) {
                  fVar22 = 1.0 / ((float)bVar3 / 255.0);
                  fVar21 = (1.0 - fVar22) * 255.0;
                  data[uVar17 * 4] = (uchar)(int)((float)data[uVar17 * 4] * fVar22 + fVar21);
                  data[uVar17 * 4 + 1] = (uchar)(int)((float)data[uVar17 * 4 + 1] * fVar22 + fVar21)
                  ;
                  data[uVar17 * 4 + 2] = (uchar)(int)((float)data[uVar17 * 4 + 2] * fVar22 + fVar21)
                  ;
                }
                uVar17 = uVar17 + 1;
              } while ((uint)((iVar7 + iVar5) * (iVar9 + iVar8)) != uVar17);
            }
            if (((req_comp & 0xfffffffbU) == 0) ||
               (data = stbi__convert_format(data,4,req_comp,x_00,y_00), data != (uchar *)0x0)) {
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   int   pixelCount;
   int channelCount, compression;
   int channel, i, count, len;
   int bitdepth;
   int w,h;
   stbi_uc *out;

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Create the destination image.
   out = (stbi_uc *) stbi__malloc(4 * w*h);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            count = 0;
            while (count < pixelCount) {
               len = stbi__get8(s);
               if (len == 128) {
                  // No-op.
               } else if (len < 128) {
                  // Copy next len+1 bytes literally.
                  len++;
                  count += len;
                  while (len) {
                     *p = stbi__get8(s);
                     p += 4;
                     len--;
                  }
               } else if (len > 128) {
                  stbi_uc   val;
                  // Next -len+1 bytes in the dest are replicated from next source byte.
                  // (Interpret len as a negative 8-bit int.)
                  len ^= 0x0FF;
                  len += 2;
                  val = stbi__get8(s);
                  count += len;
                  while (len) {
                     *p = val;
                     p += 4;
                     len--;
                  }
               }
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out + channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            stbi_uc val = channel == 3 ? 255 : 0;
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = val;
         } else {
            // Read the data.
            if (bitdepth == 16) {
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = (stbi_uc) (stbi__get16be(s) >> 8);
            } else {
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = stbi__get8(s);
            }
         }
      }
   }

   if (channelCount >= 4) {
      for (i=0; i < w*h; ++i) {
         unsigned char *pixel = out + 4*i;
         if (pixel[3] != 0 && pixel[3] != 255) {
            // remove weird white matte from PSD
            float a = pixel[3] / 255.0f;
            float ra = 1.0f / a;
            float inv_a = 255.0f * (1 - ra);
            pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
            pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
            pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
         }
      }
   }

   if (req_comp && req_comp != 4) {
      out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}